

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O1

int ccall_classify_struct(CTState *cts,CType *ct,int *rcl,CTSize ofs)

{
  CType *pCVar1;
  ushort uVar2;
  CType *pCVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = 4;
  if (ct->size < 0x11) {
    uVar2 = ct->sib;
    while (uVar2 != 0) {
      pCVar3 = cts->tab;
      pCVar1 = pCVar3 + uVar2;
      uVar4 = pCVar1->size + ofs;
      uVar5 = pCVar1->info >> 0x1c;
      if (uVar5 == 10) {
        *(byte *)(rcl + (7 < uVar4)) = *(byte *)(rcl + (7 < uVar4)) | 1;
      }
      else if (uVar5 == 9) {
        ccall_classify_ct(cts,pCVar3 + (ushort)pCVar1->info,rcl,uVar4);
      }
      else if ((pCVar1->info & 0xf0ff0000) == 0x80030000) {
        ccall_classify_struct(cts,pCVar3 + (ushort)pCVar1->info,rcl,uVar4);
      }
      uVar2 = pCVar1->sib;
    }
    uVar4 = (rcl[1] | *rcl) & 4;
  }
  return uVar4;
}

Assistant:

static int ccall_classify_struct(CTState *cts, CType *ct, int *rcl, CTSize ofs)
{
  if (ct->size > 16) return CCALL_RCL_MEM;  /* Too big, gets memory class. */
  while (ct->sib) {
    CTSize fofs;
    ct = ctype_get(cts, ct->sib);
    fofs = ofs+ct->size;
    if (ctype_isfield(ct->info))
      ccall_classify_ct(cts, ctype_rawchild(cts, ct), rcl, fofs);
    else if (ctype_isbitfield(ct->info))
      rcl[(fofs >= 8)] |= CCALL_RCL_INT;  /* NYI: unaligned bitfields? */
    else if (ctype_isxattrib(ct->info, CTA_SUBTYPE))
      ccall_classify_struct(cts, ctype_rawchild(cts, ct), rcl, fofs);
  }
  return ((rcl[0]|rcl[1]) & CCALL_RCL_MEM);  /* Memory class? */
}